

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

bool addkeyword(int type,char *name)

{
  ident local_48;
  ident *local_8;
  
  local_48.field_4.args = "";
  local_48.field_5.argmask = 0;
  local_48.fun = (identfun)0x0;
  local_48.flags = 0;
  local_48.type = type;
  local_48.name = name;
  if (initedidents == '\0') {
    if (identinits == (vector<ident> *)0x0) {
      identinits = (vector<ident> *)operator_new(0x10);
      identinits->buf = (ident *)0x0;
      identinits->alen = 0;
      identinits->ulen = 0;
    }
    vector<ident>::add(identinits,&local_48);
  }
  else {
    local_8 = hashset<ident>::access<char_const*,ident>(&idents,&local_48.name,&local_48);
    local_8->index = identmap.ulen;
    vector<ident_*>::add(&identmap,&local_8);
  }
  return true;
}

Assistant:

bool addkeyword(int type, const char *name)
{
    addident(ident(type, name, "", 0, NULL));
    return true;
}